

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BubbleJson.cpp
# Opt level: O1

ParseResults __thiscall
bubbleJson::BubbleJson::ParseStringRaw(BubbleJson *this,char **refString,size_t *refLength)

{
  char cVar1;
  byte bVar2;
  BubbleContext *pBVar3;
  size_t sVar4;
  BubbleContext *pBVar5;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  undefined1 *puVar9;
  size_t sVar10;
  ParseResults unaff_EBP;
  BubbleJson *this_00;
  char *pcVar11;
  char *ch;
  uint highSurrogate;
  uint lowSurrogate;
  uint local_48;
  uint local_44;
  char **local_40;
  ulong *local_38;
  
  pBVar3 = this->context;
  local_40 = refString;
  local_38 = refLength;
  if (*pBVar3->json != '\"') {
    __assert_fail("*this->context->json == expectChar",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/BubbleJSON/BubbleJson.cpp"
                  ,0x38,"void bubbleJson::BubbleJson::Expect(const char)");
  }
  sVar4 = pBVar3->top;
  pcVar11 = pBVar3->json + 1;
  pBVar3->json = pcVar11;
  this_00 = this;
  do {
    cVar1 = *pcVar11;
    ch = pcVar11 + 1;
    if (cVar1 == '\0') {
      pBVar3->top = sVar4;
      unaff_EBP = ParseResult_MissQuotationMark;
LAB_0010ee30:
      bVar6 = false;
      goto LAB_0010efc2;
    }
    if (cVar1 != '\\') {
      if (cVar1 == '\"') {
        uVar8 = pBVar3->top - sVar4;
        pBVar5 = this->context;
        sVar10 = pBVar5->top - uVar8;
        if (pBVar5->top < uVar8) {
          __assert_fail("this->context->top >= size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/BubbleJSON/BubbleJson.cpp"
                        ,0x11c,"void *bubbleJson::BubbleJson::ContextPop(size_t)");
        }
        pBVar5->top = sVar10;
        *local_40 = pBVar5->stack + sVar10;
        *local_38 = uVar8;
        pBVar3->json = ch;
        unaff_EBP = ParseResult_Ok;
        goto LAB_0010edcd;
      }
      if (cVar1 < ' ') {
        pBVar3->top = sVar4;
        unaff_EBP = ParseResult_InvalidStringChar;
        goto LAB_0010ee30;
      }
      this_00 = this;
      pcVar11 = (char *)ContextPush(this,1);
      *pcVar11 = cVar1;
      bVar6 = true;
      goto LAB_0010efc2;
    }
    bVar2 = pcVar11[1];
    ch = pcVar11 + 2;
    if (bVar2 < 0x62) {
      if (bVar2 == 0x22) {
        this_00 = this;
        puVar9 = (undefined1 *)ContextPush(this,1);
        *puVar9 = 0x22;
      }
      else if (bVar2 == 0x2f) {
        this_00 = this;
        puVar9 = (undefined1 *)ContextPush(this,1);
        *puVar9 = 0x2f;
      }
      else {
        if (bVar2 != 0x5c) goto switchD_0010ee66_caseD_6f;
        this_00 = this;
        puVar9 = (undefined1 *)ContextPush(this,1);
        *puVar9 = 0x5c;
      }
      goto LAB_0010efc0;
    }
    switch(bVar2) {
    case 0x6e:
      this_00 = this;
      puVar9 = (undefined1 *)ContextPush(this,1);
      *puVar9 = 10;
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
switchD_0010ee66_caseD_6f:
      pBVar3->top = sVar4;
      unaff_EBP = ParseResult_InvalidStringEscape;
      goto LAB_0010edcd;
    case 0x72:
      this_00 = this;
      puVar9 = (undefined1 *)ContextPush(this,1);
      *puVar9 = 0xd;
      break;
    case 0x74:
      this_00 = this;
      puVar9 = (undefined1 *)ContextPush(this,1);
      *puVar9 = 9;
      break;
    case 0x75:
      pcVar11 = ParseHexToInt(this_00,ch,&local_48);
      uVar7 = local_48;
      if (pcVar11 == (char *)0x0) {
LAB_0010ef9d:
        pBVar3->top = sVar4;
        unaff_EBP = ParseResult_InvalidUnicodeHex;
        ch = (char *)0x0;
      }
      else {
        if ((local_48 & 0xfffffc00) != 0xd800) {
LAB_0010efb2:
          this_00 = this;
          EncodeUTF8(this,local_48);
          ch = pcVar11;
          break;
        }
        if (*pcVar11 != '\\') {
          ch = pcVar11 + 1;
          pBVar3->top = sVar4;
          unaff_EBP = ParseResult_InvalidUnicodeSurrogate;
          bVar6 = false;
          goto LAB_0010efc2;
        }
        ch = pcVar11 + 2;
        if (pcVar11[1] == 'u') {
          ch = ParseHexToInt(this_00,ch,&local_44);
          if (ch == (char *)0x0) goto LAB_0010ef9d;
          if (0xfffffbff < local_44 - 0xe000) {
            local_48 = local_44 + uVar7 * 0x400 + 0xfca02400;
            pcVar11 = ch;
            goto LAB_0010efb2;
          }
        }
        pBVar3->top = sVar4;
        unaff_EBP = ParseResult_InvalidUnicodeSurrogate;
      }
LAB_0010edcd:
      bVar6 = false;
      goto LAB_0010efc2;
    default:
      if (bVar2 == 0x62) {
        this_00 = this;
        puVar9 = (undefined1 *)ContextPush(this,1);
        *puVar9 = 8;
      }
      else {
        if (bVar2 != 0x66) goto switchD_0010ee66_caseD_6f;
        this_00 = this;
        puVar9 = (undefined1 *)ContextPush(this,1);
        *puVar9 = 0xc;
      }
    }
LAB_0010efc0:
    bVar6 = true;
LAB_0010efc2:
    pcVar11 = ch;
    if (!bVar6) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

ParseResults BubbleJson::ParseStringRaw(char **refString, size_t *refLength)
{
    BubbleContext* c = this->context;
    size_t originTop = c->top;
    size_t lenght;
    unsigned highSurrogate, lowSurrogate;

    auto ReturnError = [=,&c](ParseResults parseResult){
        c->top = originTop;
        return parseResult;
    };

    Expect('\"');
    const char* p = c->json;
    while (true)
    {
        //traverse json
        char ch = *p;
        p++;
        switch (ch)
        {
            case '\"':
                lenght = c->top - originTop;
                *refString = (char *) ContextPop(lenght);
                *refLength = lenght;
                //current p point '\"' character
                c->json = p;
                return ParseResult_Ok;
            case '\\':
                switch (*p++) {
                    case '\"':
                        ContextPushChar('\"'); break;
                    case '\\':
                        ContextPushChar('\\'); break;
                    case '/':
                        ContextPushChar('/'); break;
                    case 'b':
                        ContextPushChar('\b'); break;
                    case 'f':
                        ContextPushChar('\f'); break;
                    case 'n':
                        ContextPushChar('\n'); break;
                    case 'r':
                        ContextPushChar('\r'); break;
                    case 't':
                        ContextPushChar('\t'); break;
                    case 'u':
                        if (!(p = ParseHexToInt(p, &highSurrogate)))
                            return ReturnError(ParseResult_InvalidUnicodeHex);
                        if (highSurrogate >= 0xD800 && highSurrogate <= 0xDBFF)//surrogate pair
                        {
                            if (*p++ != '\\')
                                return ReturnError(ParseResult_InvalidUnicodeSurrogate);
                            if (*p++ != 'u')
                                return ReturnError(ParseResult_InvalidUnicodeSurrogate);
                            if (!(p = ParseHexToInt(p, &lowSurrogate)))
                                return ReturnError(ParseResult_InvalidUnicodeHex);
                            if (lowSurrogate < 0xDC00 || lowSurrogate > 0xDFFF)
                                return ReturnError(ParseResult_InvalidUnicodeSurrogate);
                            highSurrogate = (((highSurrogate - 0xD800) << 10) | (lowSurrogate - 0xDC00)) + 0x10000;
                        }
                        EncodeUTF8(highSurrogate);
                        break;
                    default:
                        c->top = originTop;
                        return ParseResult_InvalidStringEscape;
                }
                break;
            case '\0':
                c->top = originTop;
                return ParseResult_MissQuotationMark;
            default:
                if (ch < 0x20)
                {
                    c->top = originTop;
                    return ParseResult_InvalidStringChar;
                }
                ContextPushChar(ch);
        }
    }
}